

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  NodeRef *pNVar14;
  int iVar15;
  ulong uVar16;
  RTCRayN *pRVar17;
  ulong uVar18;
  undefined4 uVar19;
  ulong unaff_RBX;
  size_t mask;
  long lVar20;
  ulong uVar21;
  size_t sVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar38;
  float fVar40;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar44;
  float fVar45;
  float fVar55;
  float fVar56;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar57;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar59;
  float fVar64;
  float fVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  undefined1 auVar63 [16];
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar107 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [16];
  undefined1 local_b71;
  long local_b70;
  undefined8 local_b68;
  float fStack_b60;
  float fStack_b5c;
  Scene *local_b58;
  float fStack_b50;
  float fStack_b4c;
  ulong local_b48;
  ulong local_b40;
  ulong local_b38;
  NodeRef *local_b30;
  RayK<4> *local_b28;
  ulong local_b20;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  undefined4 local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  undefined1 local_ad8 [16];
  undefined1 (*local_ac0) [16];
  ulong local_ab8;
  NodeRef *local_ab0;
  ulong local_aa8;
  ulong local_aa0;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar91 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar73 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar57 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar74 = fVar44 * 0.99999964;
  fVar75 = fVar58 * 0.99999964;
  fVar27 = fVar67 * 0.99999964;
  fVar44 = fVar44 * 1.0000004;
  fVar58 = fVar58 * 1.0000004;
  fVar67 = fVar67 * 1.0000004;
  local_b38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_b48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar24 = local_b38 ^ 0x10;
  local_aa0 = local_b40 ^ 0x10;
  local_aa8 = local_b48 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  iVar15 = (tray->tfar).field_0.i[k];
  auVar30._4_4_ = iVar15;
  auVar30._0_4_ = iVar15;
  auVar30._8_4_ = iVar15;
  auVar30._12_4_ = iVar15;
  local_ac0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar14 = stack + 1;
  local_b28 = ray;
  fVar28 = fVar91;
  fVar38 = fVar91;
  fVar40 = fVar91;
  fVar42 = fVar73;
  fVar45 = fVar73;
  fVar55 = fVar73;
  fVar56 = fVar57;
  fVar59 = fVar57;
  fVar64 = fVar57;
  local_b20 = uVar24;
  local_b18 = fVar57;
  fStack_b14 = fVar57;
  fStack_b10 = fVar57;
  fStack_b0c = fVar57;
  local_b08 = fVar73;
  fStack_b04 = fVar73;
  fStack_b00 = fVar73;
  fStack_afc = fVar73;
  local_ae8 = fVar91;
  fStack_ae4 = fVar91;
  fStack_ae0 = fVar91;
  fStack_adc = fVar91;
  do {
    local_ab0 = pNVar14;
    if (local_ab0 == stack) break;
    local_b30 = local_ab0 + -1;
    sVar22 = local_ab0[-1].ptr;
    do {
      if ((sVar22 & 8) == 0) {
        pfVar1 = (float *)(sVar22 + 0x20 + local_b38);
        auVar31._0_4_ = (*pfVar1 - fVar91) * fVar74;
        auVar31._4_4_ = (pfVar1[1] - fVar28) * fVar74;
        auVar31._8_4_ = (pfVar1[2] - fVar38) * fVar74;
        auVar31._12_4_ = (pfVar1[3] - fVar40) * fVar74;
        pfVar1 = (float *)(sVar22 + 0x20 + local_b40);
        auVar46._0_4_ = (*pfVar1 - fVar73) * fVar75;
        auVar46._4_4_ = (pfVar1[1] - fVar42) * fVar75;
        auVar46._8_4_ = (pfVar1[2] - fVar45) * fVar75;
        auVar46._12_4_ = (pfVar1[3] - fVar55) * fVar75;
        auVar31 = maxps(auVar31,auVar46);
        pfVar1 = (float *)(sVar22 + 0x20 + local_b48);
        auVar47._0_4_ = (*pfVar1 - fVar57) * fVar27;
        auVar47._4_4_ = (pfVar1[1] - fVar56) * fVar27;
        auVar47._8_4_ = (pfVar1[2] - fVar59) * fVar27;
        auVar47._12_4_ = (pfVar1[3] - fVar64) * fVar27;
        auVar48._4_4_ = iVar5;
        auVar48._0_4_ = iVar5;
        auVar48._8_4_ = iVar5;
        auVar48._12_4_ = iVar5;
        auVar48 = maxps(auVar47,auVar48);
        auVar48 = maxps(auVar31,auVar48);
        pfVar1 = (float *)(sVar22 + 0x20 + uVar24);
        auVar49._0_4_ = (*pfVar1 - fVar91) * fVar44;
        auVar49._4_4_ = (pfVar1[1] - fVar28) * fVar44;
        auVar49._8_4_ = (pfVar1[2] - fVar38) * fVar44;
        auVar49._12_4_ = (pfVar1[3] - fVar40) * fVar44;
        pfVar1 = (float *)(sVar22 + 0x20 + local_aa0);
        auVar60._0_4_ = (*pfVar1 - fVar73) * fVar58;
        auVar60._4_4_ = (pfVar1[1] - fVar42) * fVar58;
        auVar60._8_4_ = (pfVar1[2] - fVar45) * fVar58;
        auVar60._12_4_ = (pfVar1[3] - fVar55) * fVar58;
        auVar31 = minps(auVar49,auVar60);
        pfVar1 = (float *)(sVar22 + 0x20 + local_aa8);
        auVar61._0_4_ = (*pfVar1 - fVar57) * fVar67;
        auVar61._4_4_ = (pfVar1[1] - fVar56) * fVar67;
        auVar61._8_4_ = (pfVar1[2] - fVar59) * fVar67;
        auVar61._12_4_ = (pfVar1[3] - fVar64) * fVar67;
        auVar62 = minps(auVar61,auVar30);
        auVar31 = minps(auVar31,auVar62);
        auVar62._4_4_ = -(uint)(auVar48._4_4_ <= auVar31._4_4_);
        auVar62._0_4_ = -(uint)(auVar48._0_4_ <= auVar31._0_4_);
        auVar62._8_4_ = -(uint)(auVar48._8_4_ <= auVar31._8_4_);
        auVar62._12_4_ = -(uint)(auVar48._12_4_ <= auVar31._12_4_);
        uVar19 = movmskps((int)unaff_RBX,auVar62);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar19);
      }
      if ((sVar22 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar23 = 4;
        }
        else {
          uVar21 = sVar22 & 0xfffffffffffffff0;
          lVar20 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar23 = 0;
          sVar22 = *(size_t *)(uVar21 + lVar20 * 8);
          uVar18 = unaff_RBX - 1 & unaff_RBX;
          if (uVar18 != 0) {
            local_b30->ptr = sVar22;
            lVar20 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            uVar16 = uVar18 - 1;
            while( true ) {
              local_b30 = local_b30 + 1;
              sVar22 = *(size_t *)(uVar21 + lVar20 * 8);
              uVar16 = uVar16 & uVar18;
              if (uVar16 == 0) break;
              local_b30->ptr = sVar22;
              lVar20 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              uVar18 = uVar16 - 1;
            }
          }
        }
      }
      else {
        uVar23 = 6;
      }
    } while (uVar23 == 0);
    if (uVar23 == 6) {
      uVar23 = 0;
      local_ab8 = (ulong)((uint)sVar22 & 0xf) - 8;
      bVar25 = local_ab8 != 0;
      if (bVar25) {
        uVar18 = sVar22 & 0xfffffffffffffff0;
        uVar21 = 0;
        do {
          local_b70 = uVar21 * 0xb0;
          fVar91 = *(float *)(local_b28 + k * 4);
          fVar73 = *(float *)(local_b28 + k * 4 + 0x10);
          fVar57 = *(float *)(local_b28 + k * 4 + 0x20);
          pfVar1 = (float *)(uVar18 + local_b70);
          pfVar2 = (float *)(uVar18 + 0x10 + local_b70);
          pfVar3 = (float *)(uVar18 + 0x20 + local_b70);
          pfVar4 = (float *)(uVar18 + 0x30 + local_b70);
          fVar128 = *pfVar1 - fVar91;
          fVar130 = pfVar1[1] - fVar91;
          fVar131 = pfVar1[2] - fVar91;
          fVar132 = pfVar1[3] - fVar91;
          fVar101 = *pfVar2 - fVar73;
          fVar102 = pfVar2[1] - fVar73;
          fVar103 = pfVar2[2] - fVar73;
          fVar104 = pfVar2[3] - fVar73;
          fVar118 = *pfVar3 - fVar57;
          fVar120 = pfVar3[1] - fVar57;
          fVar122 = pfVar3[2] - fVar57;
          fVar123 = pfVar3[3] - fVar57;
          fVar28 = *pfVar4 - fVar91;
          fVar38 = pfVar4[1] - fVar91;
          fVar40 = pfVar4[2] - fVar91;
          fVar42 = pfVar4[3] - fVar91;
          pfVar1 = (float *)(uVar18 + 0x40 + local_b70);
          fVar59 = *pfVar1 - fVar73;
          fVar64 = pfVar1[1] - fVar73;
          fVar65 = pfVar1[2] - fVar73;
          fVar66 = pfVar1[3] - fVar73;
          pfVar1 = (float *)(uVar18 + 0x50 + local_b70);
          fVar82 = *pfVar1 - fVar57;
          fVar83 = pfVar1[1] - fVar57;
          fVar84 = pfVar1[2] - fVar57;
          fVar85 = pfVar1[3] - fVar57;
          pfVar1 = (float *)(uVar18 + 0x60 + local_b70);
          fVar86 = *pfVar1 - fVar91;
          fVar89 = pfVar1[1] - fVar91;
          fVar90 = pfVar1[2] - fVar91;
          fVar91 = pfVar1[3] - fVar91;
          pfVar1 = (float *)(uVar18 + 0x70 + local_b70);
          fVar68 = *pfVar1 - fVar73;
          fVar71 = pfVar1[1] - fVar73;
          fVar72 = pfVar1[2] - fVar73;
          fVar73 = pfVar1[3] - fVar73;
          pfVar1 = (float *)(uVar18 + 0x80 + local_b70);
          fVar45 = *pfVar1 - fVar57;
          fVar55 = pfVar1[1] - fVar57;
          fVar56 = pfVar1[2] - fVar57;
          fVar57 = pfVar1[3] - fVar57;
          fVar97 = fVar86 - fVar128;
          fVar98 = fVar89 - fVar130;
          fVar99 = fVar90 - fVar131;
          fVar100 = fVar91 - fVar132;
          fVar114 = fVar68 - fVar101;
          fVar115 = fVar71 - fVar102;
          fVar116 = fVar72 - fVar103;
          fVar117 = fVar73 - fVar104;
          fVar105 = fVar45 - fVar118;
          fVar108 = fVar55 - fVar120;
          fVar110 = fVar56 - fVar122;
          fVar112 = fVar57 - fVar123;
          fStack_b50 = *(float *)(local_b28 + k * 4 + 0x50);
          fVar87 = *(float *)(local_b28 + k * 4 + 0x60);
          fStack_af4 = *(float *)(local_b28 + k * 4 + 0x40);
          fVar124 = (fVar114 * (fVar118 + fVar45) - (fVar101 + fVar68) * fVar105) * fStack_af4 +
                    ((fVar128 + fVar86) * fVar105 - (fVar118 + fVar45) * fVar97) * fStack_b50 +
                    (fVar97 * (fVar101 + fVar68) - (fVar128 + fVar86) * fVar114) * fVar87;
          fVar125 = (fVar115 * (fVar120 + fVar55) - (fVar102 + fVar71) * fVar108) * fStack_af4 +
                    ((fVar130 + fVar89) * fVar108 - (fVar120 + fVar55) * fVar98) * fStack_b50 +
                    (fVar98 * (fVar102 + fVar71) - (fVar130 + fVar89) * fVar115) * fVar87;
          fVar126 = (fVar116 * (fVar122 + fVar56) - (fVar103 + fVar72) * fVar110) * fStack_af4 +
                    ((fVar131 + fVar90) * fVar110 - (fVar122 + fVar56) * fVar99) * fStack_b50 +
                    (fVar99 * (fVar103 + fVar72) - (fVar131 + fVar90) * fVar116) * fVar87;
          fVar127 = (fVar117 * (fVar123 + fVar57) - (fVar104 + fVar73) * fVar112) * fStack_af4 +
                    ((fVar132 + fVar91) * fVar112 - (fVar123 + fVar57) * fVar100) * fStack_b50 +
                    (fVar100 * (fVar104 + fVar73) - (fVar132 + fVar91) * fVar117) * fVar87;
          fVar76 = fVar128 - fVar28;
          fVar79 = fVar130 - fVar38;
          fVar80 = fVar131 - fVar40;
          fVar81 = fVar132 - fVar42;
          fVar92 = fVar101 - fVar59;
          fVar94 = fVar102 - fVar64;
          fVar95 = fVar103 - fVar65;
          fVar96 = fVar104 - fVar66;
          fVar106 = fVar118 - fVar82;
          fVar109 = fVar120 - fVar83;
          fVar111 = fVar122 - fVar84;
          fVar113 = fVar123 - fVar85;
          auVar77._0_4_ =
               (fVar92 * (fVar118 + fVar82) - (fVar101 + fVar59) * fVar106) * fStack_af4 +
               ((fVar128 + fVar28) * fVar106 - (fVar118 + fVar82) * fVar76) * fStack_b50 +
               (fVar76 * (fVar101 + fVar59) - (fVar128 + fVar28) * fVar92) * fVar87;
          auVar77._4_4_ =
               (fVar94 * (fVar120 + fVar83) - (fVar102 + fVar64) * fVar109) * fStack_af4 +
               ((fVar130 + fVar38) * fVar109 - (fVar120 + fVar83) * fVar79) * fStack_b50 +
               (fVar79 * (fVar102 + fVar64) - (fVar130 + fVar38) * fVar94) * fVar87;
          auVar77._8_4_ =
               (fVar95 * (fVar122 + fVar84) - (fVar103 + fVar65) * fVar111) * fStack_af4 +
               ((fVar131 + fVar40) * fVar111 - (fVar122 + fVar84) * fVar80) * fStack_b50 +
               (fVar80 * (fVar103 + fVar65) - (fVar131 + fVar40) * fVar95) * fVar87;
          auVar77._12_4_ =
               (fVar96 * (fVar123 + fVar85) - (fVar104 + fVar66) * fVar113) * fStack_af4 +
               ((fVar132 + fVar42) * fVar113 - (fVar123 + fVar85) * fVar81) * fStack_b50 +
               (fVar81 * (fVar104 + fVar66) - (fVar132 + fVar42) * fVar96) * fVar87;
          fVar29 = fVar28 - fVar86;
          fVar39 = fVar38 - fVar89;
          fVar41 = fVar40 - fVar90;
          fVar43 = fVar42 - fVar91;
          fVar119 = fVar59 - fVar68;
          fVar121 = fVar64 - fVar71;
          fStack_b60 = fVar65 - fVar72;
          fStack_b5c = fVar66 - fVar73;
          local_a98 = fVar82 - fVar45;
          fStack_a94 = fVar83 - fVar55;
          fStack_a90 = fVar84 - fVar56;
          fStack_a8c = fVar85 - fVar57;
          local_b68 = CONCAT44(fVar121,fVar119);
          auVar63._0_4_ =
               (fVar119 * (fVar45 + fVar82) - (fVar68 + fVar59) * local_a98) * fStack_af4 +
               ((fVar86 + fVar28) * local_a98 - (fVar45 + fVar82) * fVar29) * fStack_b50 +
               (fVar29 * (fVar68 + fVar59) - (fVar86 + fVar28) * fVar119) * fVar87;
          auVar63._4_4_ =
               (fVar121 * (fVar55 + fVar83) - (fVar71 + fVar64) * fStack_a94) * fStack_af4 +
               ((fVar89 + fVar38) * fStack_a94 - (fVar55 + fVar83) * fVar39) * fStack_b50 +
               (fVar39 * (fVar71 + fVar64) - (fVar89 + fVar38) * fVar121) * fVar87;
          auVar63._8_4_ =
               (fStack_b60 * (fVar56 + fVar84) - (fVar72 + fVar65) * fStack_a90) * fStack_af4 +
               ((fVar90 + fVar40) * fStack_a90 - (fVar56 + fVar84) * fVar41) * fStack_b50 +
               (fVar41 * (fVar72 + fVar65) - (fVar90 + fVar40) * fStack_b60) * fVar87;
          auVar63._12_4_ =
               (fStack_b5c * (fVar57 + fVar85) - (fVar73 + fVar66) * fStack_a8c) * fStack_af4 +
               ((fVar91 + fVar42) * fStack_a8c - (fVar57 + fVar85) * fVar43) * fStack_b50 +
               (fVar43 * (fVar73 + fVar66) - (fVar91 + fVar42) * fStack_b5c) * fVar87;
          fVar65 = auVar77._0_4_ + fVar124 + auVar63._0_4_;
          fVar66 = auVar77._4_4_ + fVar125 + auVar63._4_4_;
          fVar68 = auVar77._8_4_ + fVar126 + auVar63._8_4_;
          fVar71 = auVar77._12_4_ + fVar127 + auVar63._12_4_;
          auVar32._4_4_ = fVar125;
          auVar32._0_4_ = fVar124;
          auVar32._8_4_ = fVar126;
          auVar32._12_4_ = fVar127;
          auVar48 = minps(auVar32,auVar77);
          auVar48 = minps(auVar48,auVar63);
          auVar69._4_4_ = fVar125;
          auVar69._0_4_ = fVar124;
          auVar69._8_4_ = fVar126;
          auVar69._12_4_ = fVar127;
          auVar31 = maxps(auVar69,auVar77);
          auVar31 = maxps(auVar31,auVar63);
          fVar91 = ABS(fVar65) * 1.1920929e-07;
          fVar73 = ABS(fVar66) * 1.1920929e-07;
          fVar57 = ABS(fVar68) * 1.1920929e-07;
          fVar28 = ABS(fVar71) * 1.1920929e-07;
          auVar70._4_4_ = -(uint)(auVar31._4_4_ <= fVar73);
          auVar70._0_4_ = -(uint)(auVar31._0_4_ <= fVar91);
          auVar70._8_4_ = -(uint)(auVar31._8_4_ <= fVar57);
          auVar70._12_4_ = -(uint)(auVar31._12_4_ <= fVar28);
          auVar33._4_4_ = -(uint)(-fVar73 <= auVar48._4_4_);
          auVar33._0_4_ = -(uint)(-fVar91 <= auVar48._0_4_);
          auVar33._8_4_ = -(uint)(-fVar57 <= auVar48._8_4_);
          auVar33._12_4_ = -(uint)(-fVar28 <= auVar48._12_4_);
          auVar70 = auVar70 | auVar33;
          iVar15 = movmskps((int)&local_b71,auVar70);
          fVar91 = local_ae8;
          fVar28 = fStack_ae4;
          fVar38 = fStack_ae0;
          fVar40 = fStack_adc;
          fVar73 = local_b08;
          fVar42 = fStack_b04;
          fVar45 = fStack_b00;
          fVar55 = fStack_afc;
          fVar57 = local_b18;
          fVar56 = fStack_b14;
          fVar59 = fStack_b10;
          fVar64 = fStack_b0c;
          if (iVar15 != 0) {
            auVar93._0_4_ = fVar92 * local_a98 - fVar106 * fVar119;
            auVar93._4_4_ = fVar94 * fStack_a94 - fVar109 * fVar121;
            auVar93._8_4_ = fVar95 * fStack_a90 - fVar111 * fStack_b60;
            auVar93._12_4_ = fVar96 * fStack_a8c - fVar113 * fStack_b5c;
            auVar34._4_4_ = -(uint)(ABS(fVar94 * fVar108) < ABS(fVar109 * fVar121));
            auVar34._0_4_ = -(uint)(ABS(fVar92 * fVar105) < ABS(fVar106 * fVar119));
            auVar34._8_4_ = -(uint)(ABS(fVar95 * fVar110) < ABS(fVar111 * fStack_b60));
            auVar34._12_4_ = -(uint)(ABS(fVar96 * fVar112) < ABS(fVar113 * fStack_b5c));
            auVar12._4_4_ = fVar115 * fVar109 - fVar94 * fVar108;
            auVar12._0_4_ = fVar114 * fVar106 - fVar92 * fVar105;
            auVar12._8_4_ = fVar116 * fVar111 - fVar95 * fVar110;
            auVar12._12_4_ = fVar117 * fVar113 - fVar96 * fVar112;
            local_898 = blendvps(auVar93,auVar12,auVar34);
            auVar107._0_4_ = fVar106 * fVar29 - fVar76 * local_a98;
            auVar107._4_4_ = fVar109 * fVar39 - fVar79 * fStack_a94;
            auVar107._8_4_ = fVar111 * fVar41 - fVar80 * fStack_a90;
            auVar107._12_4_ = fVar113 * fVar43 - fVar81 * fStack_a8c;
            auVar35._4_4_ = -(uint)(ABS(fVar109 * fVar98) < ABS(fVar79 * fStack_a94));
            auVar35._0_4_ = -(uint)(ABS(fVar106 * fVar97) < ABS(fVar76 * local_a98));
            auVar35._8_4_ = -(uint)(ABS(fVar111 * fVar99) < ABS(fVar80 * fStack_a90));
            auVar35._12_4_ = -(uint)(ABS(fVar113 * fVar100) < ABS(fVar81 * fStack_a8c));
            auVar9._4_4_ = fVar108 * fVar79 - fVar109 * fVar98;
            auVar9._0_4_ = fVar105 * fVar76 - fVar106 * fVar97;
            auVar9._8_4_ = fVar110 * fVar80 - fVar111 * fVar99;
            auVar9._12_4_ = fVar112 * fVar81 - fVar113 * fVar100;
            local_888 = blendvps(auVar107,auVar9,auVar35);
            auVar129._0_4_ = fVar76 * fVar119 - fVar92 * fVar29;
            auVar129._4_4_ = fVar79 * fVar121 - fVar94 * fVar39;
            auVar129._8_4_ = fVar80 * fStack_b60 - fVar95 * fVar41;
            auVar129._12_4_ = fVar81 * fStack_b5c - fVar96 * fVar43;
            auVar36._4_4_ = -(uint)(ABS(fVar79 * fVar115) < ABS(fVar94 * fVar39));
            auVar36._0_4_ = -(uint)(ABS(fVar76 * fVar114) < ABS(fVar92 * fVar29));
            auVar36._8_4_ = -(uint)(ABS(fVar80 * fVar116) < ABS(fVar95 * fVar41));
            auVar36._12_4_ = -(uint)(ABS(fVar81 * fVar117) < ABS(fVar96 * fVar43));
            auVar11._4_4_ = fVar98 * fVar94 - fVar79 * fVar115;
            auVar11._0_4_ = fVar97 * fVar92 - fVar76 * fVar114;
            auVar11._8_4_ = fVar99 * fVar95 - fVar80 * fVar116;
            auVar11._12_4_ = fVar100 * fVar96 - fVar81 * fVar117;
            local_878 = blendvps(auVar129,auVar11,auVar36);
            fVar80 = fStack_af4 * local_898._0_4_ +
                     fStack_b50 * local_888._0_4_ + fVar87 * local_878._0_4_;
            fVar81 = fStack_af4 * local_898._4_4_ +
                     fStack_b50 * local_888._4_4_ + fVar87 * local_878._4_4_;
            fVar82 = fStack_af4 * local_898._8_4_ +
                     fStack_b50 * local_888._8_4_ + fVar87 * local_878._8_4_;
            fVar83 = fStack_af4 * local_898._12_4_ +
                     fStack_b50 * local_888._12_4_ + fVar87 * local_878._12_4_;
            fVar80 = fVar80 + fVar80;
            fVar81 = fVar81 + fVar81;
            fVar82 = fVar82 + fVar82;
            fVar83 = fVar83 + fVar83;
            auVar50._0_4_ = fVar118 * local_878._0_4_;
            auVar50._4_4_ = fVar120 * local_878._4_4_;
            auVar50._8_4_ = fVar122 * local_878._8_4_;
            auVar50._12_4_ = fVar123 * local_878._12_4_;
            fVar43 = fVar128 * local_898._0_4_ + fVar101 * local_888._0_4_ + auVar50._0_4_;
            fVar72 = fVar130 * local_898._4_4_ + fVar102 * local_888._4_4_ + auVar50._4_4_;
            fVar76 = fVar131 * local_898._8_4_ + fVar103 * local_888._8_4_ + auVar50._8_4_;
            fVar79 = fVar132 * local_898._12_4_ + fVar104 * local_888._12_4_ + auVar50._12_4_;
            auVar10._4_4_ = fVar81;
            auVar10._0_4_ = fVar80;
            auVar10._8_4_ = fVar82;
            auVar10._12_4_ = fVar83;
            auVar48 = rcpps(auVar50,auVar10);
            fVar87 = auVar48._0_4_;
            fVar29 = auVar48._4_4_;
            fVar39 = auVar48._8_4_;
            fVar41 = auVar48._12_4_;
            local_8a8._0_4_ = ((1.0 - fVar80 * fVar87) * fVar87 + fVar87) * (fVar43 + fVar43);
            local_8a8._4_4_ = ((1.0 - fVar81 * fVar29) * fVar29 + fVar29) * (fVar72 + fVar72);
            local_8a8._8_4_ = ((1.0 - fVar82 * fVar39) * fVar39 + fVar39) * (fVar76 + fVar76);
            local_8a8._12_4_ = ((1.0 - fVar83 * fVar41) * fVar41 + fVar41) * (fVar79 + fVar79);
            fVar87 = *(float *)(local_b28 + k * 4 + 0x80);
            fVar29 = *(float *)(local_b28 + k * 4 + 0x30);
            auVar51._0_4_ =
                 -(uint)(local_8a8._0_4_ <= fVar87 && fVar29 <= local_8a8._0_4_) & auVar70._0_4_;
            auVar51._4_4_ =
                 -(uint)(local_8a8._4_4_ <= fVar87 && fVar29 <= local_8a8._4_4_) & auVar70._4_4_;
            auVar51._8_4_ =
                 -(uint)(local_8a8._8_4_ <= fVar87 && fVar29 <= local_8a8._8_4_) & auVar70._8_4_;
            auVar51._12_4_ =
                 -(uint)(local_8a8._12_4_ <= fVar87 && fVar29 <= local_8a8._12_4_) & auVar70._12_4_;
            iVar15 = movmskps(iVar15,auVar51);
            if (iVar15 != 0) {
              auVar52._0_4_ = auVar51._0_4_ & -(uint)(fVar80 != 0.0);
              auVar52._4_4_ = auVar51._4_4_ & -(uint)(fVar81 != 0.0);
              auVar52._8_4_ = auVar51._8_4_ & -(uint)(fVar82 != 0.0);
              auVar52._12_4_ = auVar51._12_4_ & -(uint)(fVar83 != 0.0);
              iVar15 = movmskps((int)local_b70,auVar52);
              uVar24 = CONCAT44((int)((ulong)local_b70 >> 0x20),iVar15);
              if (iVar15 != 0) {
                local_b70 = local_b70 + uVar18;
                auVar13._4_4_ = fVar66;
                auVar13._0_4_ = fVar65;
                auVar13._8_4_ = fVar68;
                auVar13._12_4_ = fVar71;
                local_b58 = context->scene;
                auVar48 = rcpps(local_8a8,auVar13);
                fVar87 = auVar48._0_4_;
                fVar29 = auVar48._4_4_;
                fVar39 = auVar48._8_4_;
                fVar41 = auVar48._12_4_;
                fVar87 = (float)(-(uint)(1e-18 <= ABS(fVar65)) &
                                (uint)(((float)DAT_01feca10 - fVar65 * fVar87) * fVar87 + fVar87));
                fVar29 = (float)(-(uint)(1e-18 <= ABS(fVar66)) &
                                (uint)((DAT_01feca10._4_4_ - fVar66 * fVar29) * fVar29 + fVar29));
                fVar39 = (float)(-(uint)(1e-18 <= ABS(fVar68)) &
                                (uint)((DAT_01feca10._8_4_ - fVar68 * fVar39) * fVar39 + fVar39));
                fVar41 = (float)(-(uint)(1e-18 <= ABS(fVar71)) &
                                (uint)((DAT_01feca10._12_4_ - fVar71 * fVar41) * fVar41 + fVar41));
                auVar78._0_4_ = fVar124 * fVar87;
                auVar78._4_4_ = fVar125 * fVar29;
                auVar78._8_4_ = fVar126 * fVar39;
                auVar78._12_4_ = fVar127 * fVar41;
                local_8c8 = minps(auVar78,_DAT_01feca10);
                auVar88._0_4_ = fVar87 * auVar77._0_4_;
                auVar88._4_4_ = fVar29 * auVar77._4_4_;
                auVar88._8_4_ = fVar39 * auVar77._8_4_;
                auVar88._12_4_ = fVar41 * auVar77._12_4_;
                local_8b8 = minps(auVar88,_DAT_01feca10);
                fStack_b4c = fStack_b50;
                fStack_af0 = fStack_af4;
                fStack_aec = fStack_af4;
                do {
                  uVar16 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  local_808 = *(uint *)(local_b70 + 0x90 + uVar16 * 4);
                  pGVar7 = (local_b58->geometries).items[local_808].ptr;
                  if ((pGVar7->mask & *(uint *)(local_b28 + k * 4 + 0x90)) == 0) {
                    uVar24 = uVar24 ^ 1L << (uVar16 & 0x3f);
                    bVar26 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar26 = false;
                  }
                  else {
                    local_af8 = *(undefined4 *)(local_b28 + k * 4 + 0x80);
                    local_838 = *(undefined4 *)(local_8c8 + uVar16 * 4);
                    uVar19 = *(undefined4 *)(local_8b8 + uVar16 * 4);
                    *(undefined4 *)(local_b28 + k * 4 + 0x80) =
                         *(undefined4 *)(local_8a8 + uVar16 * 4);
                    args.context = context->user;
                    uVar6 = *(undefined4 *)(local_b70 + 0xa0 + uVar16 * 4);
                    local_818._4_4_ = uVar6;
                    local_818._0_4_ = uVar6;
                    local_818._8_4_ = uVar6;
                    local_818._12_4_ = uVar6;
                    local_828._4_4_ = uVar19;
                    local_828._0_4_ = uVar19;
                    local_828._8_4_ = uVar19;
                    local_828._12_4_ = uVar19;
                    uVar19 = *(undefined4 *)(local_898 + uVar16 * 4);
                    local_858 = *(undefined4 *)(local_888 + uVar16 * 4);
                    uVar6 = *(undefined4 *)(local_878 + uVar16 * 4);
                    local_848._4_4_ = uVar6;
                    local_848._0_4_ = uVar6;
                    local_848._8_4_ = uVar6;
                    local_848._12_4_ = uVar6;
                    local_868[0] = (RTCHitN)(char)uVar19;
                    local_868[1] = (RTCHitN)(char)((uint)uVar19 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar19;
                    local_868[5] = (RTCHitN)(char)((uint)uVar19 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar19;
                    local_868[9] = (RTCHitN)(char)((uint)uVar19 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar19;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar19 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
                    uStack_854 = local_858;
                    uStack_850 = local_858;
                    uStack_84c = local_858;
                    uStack_834 = local_838;
                    uStack_830 = local_838;
                    uStack_82c = local_838;
                    uStack_804 = local_808;
                    uStack_800 = local_808;
                    uStack_7fc = local_808;
                    local_7f8 = (args.context)->instID[0];
                    uStack_7f4 = local_7f8;
                    uStack_7f0 = local_7f8;
                    uStack_7ec = local_7f8;
                    local_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = local_7e8;
                    uStack_7e0 = local_7e8;
                    uStack_7dc = local_7e8;
                    local_ad8 = *local_ac0;
                    args.valid = (int *)local_ad8;
                    args.geometryUserPtr = pGVar7->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    pRVar17 = (RTCRayN *)pGVar7->occlusionFilterN;
                    args.ray = (RTCRayN *)local_b28;
                    if (pRVar17 != (RTCRayN *)0x0) {
                      local_b68 = k;
                      pRVar17 = (RTCRayN *)(*(code *)pRVar17)(&args);
                      k = local_b68;
                      fVar91 = local_ae8;
                      fVar28 = fStack_ae4;
                      fVar38 = fStack_ae0;
                      fVar40 = fStack_adc;
                      fVar73 = local_b08;
                      fVar42 = fStack_b04;
                      fVar45 = fStack_b00;
                      fVar55 = fStack_afc;
                      fVar57 = local_b18;
                      fVar56 = fStack_b14;
                      fVar59 = fStack_b10;
                      fVar64 = fStack_b0c;
                    }
                    if (local_ad8 == (undefined1  [16])0x0) {
                      auVar53._8_4_ = 0xffffffff;
                      auVar53._0_8_ = 0xffffffffffffffff;
                      auVar53._12_4_ = 0xffffffff;
                      auVar53 = auVar53 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&args);
                        fVar91 = local_ae8;
                        fVar28 = fStack_ae4;
                        fVar38 = fStack_ae0;
                        fVar40 = fStack_adc;
                        fVar73 = local_b08;
                        fVar42 = fStack_b04;
                        fVar45 = fStack_b00;
                        fVar55 = fStack_afc;
                        fVar57 = local_b18;
                        fVar56 = fStack_b14;
                        fVar59 = fStack_b10;
                        fVar64 = fStack_b0c;
                      }
                      auVar37._0_4_ = -(uint)(local_ad8._0_4_ == 0);
                      auVar37._4_4_ = -(uint)(local_ad8._4_4_ == 0);
                      auVar37._8_4_ = -(uint)(local_ad8._8_4_ == 0);
                      auVar37._12_4_ = -(uint)(local_ad8._12_4_ == 0);
                      auVar53 = auVar37 ^ _DAT_01febe20;
                      auVar48 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar37);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
                      pRVar17 = args.ray;
                    }
                    auVar54._0_4_ = auVar53._0_4_ << 0x1f;
                    auVar54._4_4_ = auVar53._4_4_ << 0x1f;
                    auVar54._8_4_ = auVar53._8_4_ << 0x1f;
                    auVar54._12_4_ = auVar53._12_4_ << 0x1f;
                    iVar15 = movmskps((int)pRVar17,auVar54);
                    bVar26 = iVar15 == 0;
                    if (bVar26) {
                      *(undefined4 *)(local_b28 + k * 4 + 0x80) = local_af8;
                      uVar24 = uVar24 ^ 1L << (uVar16 & 0x3f);
                    }
                  }
                  uVar23 = 0;
                  if (!bVar26) {
                    uVar24 = local_b20;
                    if (bVar25) {
                      *(undefined4 *)(local_b28 + k * 4 + 0x80) = 0xff800000;
                      uVar23 = 1;
                    }
                    goto LAB_0026ec45;
                  }
                } while (uVar24 != 0);
              }
            }
          }
          uVar23 = 0;
          uVar21 = uVar21 + 1;
          bVar25 = uVar21 < local_ab8;
          uVar24 = local_b20;
        } while (uVar21 != local_ab8);
      }
    }
LAB_0026ec45:
    pNVar14 = local_b30;
  } while ((uVar23 & 3) == 0);
  return local_ab0 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }